

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

JavascriptArray *
Js::JavascriptArray::GetArrayForArrayOrObjectWithArray
          (Var var,bool *isObjectWithArrayRef,TypeId *arrayTypeIdRef)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DynamicObject *this;
  ArrayObject *obj;
  JavascriptArray *local_48;
  ArrayObject *objectArray;
  INT_PTR vtable;
  JavascriptArray *array;
  TypeId *arrayTypeIdRef_local;
  bool *isObjectWithArrayRef_local;
  Var var_local;
  
  if (var == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x298,"(var)","var");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (isObjectWithArrayRef == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x299,"(isObjectWithArrayRef)","isObjectWithArrayRef");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (arrayTypeIdRef == (TypeId *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x29a,"(arrayTypeIdRef)","arrayTypeIdRef");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  *isObjectWithArrayRef = false;
  *arrayTypeIdRef = TypeIds_Undefined;
  bVar2 = VarIs<Js::RecyclableObject>(var);
  if (bVar2) {
    vtable = 0;
    objectArray = (ArrayObject *)VirtualTableInfoBase::GetVirtualTable(var);
    if (objectArray == (ArrayObject *)VirtualTableInfo<Js::DynamicObject>::Address) {
      this = VarTo<Js::DynamicObject>(var);
      obj = DynamicObject::GetObjectArray(this);
      if ((obj == (ArrayObject *)0x0) || (bVar2 = IsNonES5Array(obj), !bVar2)) {
        local_48 = (JavascriptArray *)0x0;
      }
      else {
        local_48 = VarTo<Js::JavascriptArray,Js::ArrayObject>(obj);
      }
      vtable = (INT_PTR)local_48;
      if (local_48 == (JavascriptArray *)0x0) {
        return (JavascriptArray *)0x0;
      }
      *isObjectWithArrayRef = true;
      objectArray = (ArrayObject *)VirtualTableInfoBase::GetVirtualTable(local_48);
    }
    if (objectArray == (ArrayObject *)VirtualTableInfo<Js::JavascriptArray>::Address) {
      *arrayTypeIdRef = TypeIds_Array;
    }
    else if (objectArray == (ArrayObject *)VirtualTableInfo<Js::JavascriptNativeIntArray>::Address)
    {
      *arrayTypeIdRef = TypeIds_NativeIntArray;
    }
    else {
      if (objectArray != (ArrayObject *)VirtualTableInfo<Js::JavascriptNativeFloatArray>::Address) {
        return (JavascriptArray *)0x0;
      }
      *arrayTypeIdRef = TypeIds_ArrayLast;
    }
    if (vtable == 0) {
      vtable = (INT_PTR)VarTo<Js::JavascriptArray>(var);
    }
    var_local = (Var)vtable;
  }
  else {
    var_local = (Var)0x0;
  }
  return (JavascriptArray *)var_local;
}

Assistant:

JavascriptArray *JavascriptArray::GetArrayForArrayOrObjectWithArray(
        const Var var,
        bool *const isObjectWithArrayRef,
        TypeId *const arrayTypeIdRef)
    {
        // This is a helper function used by jitted code. The array checks done here match the array checks done by jitted code
        // (see Lowerer::GenerateArrayTest) to minimize bailouts.

        Assert(var);
        Assert(isObjectWithArrayRef);
        Assert(arrayTypeIdRef);

        *isObjectWithArrayRef = false;
        *arrayTypeIdRef = TypeIds_Undefined;

        if(!VarIs<RecyclableObject>(var))
        {
            return nullptr;
        }

        JavascriptArray *array = nullptr;
        INT_PTR vtable = VirtualTableInfoBase::GetVirtualTable(var);
        if(vtable == VirtualTableInfo<DynamicObject>::Address)
        {
            ArrayObject* objectArray = VarTo<DynamicObject>(var)->GetObjectArray();
            array = (objectArray && IsNonES5Array(objectArray)) ? VarTo<JavascriptArray>(objectArray) : nullptr;
            if(!array)
            {
                return nullptr;
            }
            *isObjectWithArrayRef = true;
            vtable = VirtualTableInfoBase::GetVirtualTable(array);
        }

        if(vtable == VirtualTableInfo<JavascriptArray>::Address)
        {
            *arrayTypeIdRef = TypeIds_Array;
        }
        else if(vtable == VirtualTableInfo<JavascriptNativeIntArray>::Address)
        {
            *arrayTypeIdRef = TypeIds_NativeIntArray;
        }
        else if(vtable == VirtualTableInfo<JavascriptNativeFloatArray>::Address)
        {
            *arrayTypeIdRef = TypeIds_NativeFloatArray;
        }
        else
        {
            return nullptr;
        }

        if(!array)
        {
            array = VarTo<JavascriptArray>(var);
        }
        return array;
    }